

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

BreakpointProbe * __thiscall
JsrtDebugManager::SetBreakpointHelper_TTD
          (JsrtDebugManager *this,int64 desiredBpId,ScriptContext *scriptContext,
          Utf8SourceInfo *utf8SourceInfo,UINT lineNumber,UINT columnNumber,BOOL *isNewBP)

{
  StatementLocation statement_00;
  StatementLocation statement_01;
  HRESULT HVar1;
  BOOL BVar2;
  UINT bpId;
  ulong uVar3;
  size_t sVar4;
  JsrtDebugDocumentManager *this_00;
  BreakpointProbe *local_70;
  BreakpointProbe *probe;
  StatementLocation statement;
  long ibos;
  charcount_t byteOffset;
  charcount_t charPosition;
  DebugDocument *debugDocument;
  UINT columnNumber_local;
  UINT lineNumber_local;
  Utf8SourceInfo *utf8SourceInfo_local;
  ScriptContext *scriptContext_local;
  int64 desiredBpId_local;
  JsrtDebugManager *this_local;
  
  *isNewBP = 0;
  debugDocument._0_4_ = columnNumber;
  debugDocument._4_4_ = lineNumber;
  _columnNumber_local = utf8SourceInfo;
  utf8SourceInfo_local = (Utf8SourceInfo *)scriptContext;
  scriptContext_local = (ScriptContext *)desiredBpId;
  desiredBpId_local = (int64)this;
  _byteOffset = Js::Utf8SourceInfo::GetDebugDocument(utf8SourceInfo);
  if (((_byteOffset == (DebugDocument *)0x0) ||
      (HVar1 = Js::Utf8SourceInfo::EnsureLineOffsetCacheNoThrow(_columnNumber_local), HVar1 < 0)) ||
     (uVar3 = (ulong)debugDocument._4_4_,
     sVar4 = Js::Utf8SourceInfo::GetLineCount(_columnNumber_local), sVar4 <= uVar3)) {
    return (BreakpointProbe *)0x0;
  }
  ibos._4_4_ = 0;
  ibos._0_4_ = 0;
  Js::Utf8SourceInfo::GetCharPositionForLineInfo
            (_columnNumber_local,debugDocument._4_4_,(charcount_t *)((long)&ibos + 4),
             (charcount_t *)&ibos);
  statement.bytecodeSpan.begin = ibos._4_4_ + (UINT)debugDocument + 1;
  statement.bytecodeSpan.end = 0;
  Js::StatementLocation::StatementLocation((StatementLocation *)&probe);
  BVar2 = Js::DebugDocument::GetStatementLocation
                    (_byteOffset,statement.bytecodeSpan.begin,(StatementLocation *)&probe);
  if (BVar2 == 0) {
    return (BreakpointProbe *)0x0;
  }
  statement_00.statement = (Interval)statement.function;
  statement_00.function = (FunctionBody *)probe;
  statement_00.bytecodeSpan = statement.statement;
  local_70 = Js::DebugDocument::FindBreakpoint(_byteOffset,statement_00);
  if ((local_70 != (BreakpointProbe *)0x0) &&
     (scriptContext_local != (ScriptContext *)&DAT_ffffffffffffffff)) {
    TTDAbort_unrecoverable_error
              ("We shouldn\'t be resetting this BP unless it was cleared earlier!");
  }
  if (local_70 == (BreakpointProbe *)0x0) {
    statement_01.statement = (Interval)statement.function;
    statement_01.function = (FunctionBody *)probe;
    statement_01.bytecodeSpan = statement.statement;
    local_70 = Js::DebugDocument::SetBreakPoint_TTDWbpId
                         (_byteOffset,(int64)scriptContext_local,statement_01);
    *isNewBP = 1;
    this_00 = GetDebugDocumentManager(this);
    bpId = Js::BreakpointProbe::GetId(local_70);
    JsrtDebugDocumentManager::AddDocument(this_00,bpId,_byteOffset);
  }
  return local_70;
}

Assistant:

Js::BreakpointProbe* JsrtDebugManager::SetBreakpointHelper_TTD(int64 desiredBpId, Js::ScriptContext* scriptContext, Js::Utf8SourceInfo* utf8SourceInfo, UINT lineNumber, UINT columnNumber, BOOL* isNewBP)
{
    *isNewBP = FALSE;
    Js::DebugDocument* debugDocument = utf8SourceInfo->GetDebugDocument();
    if(debugDocument != nullptr && SUCCEEDED(utf8SourceInfo->EnsureLineOffsetCacheNoThrow()) && lineNumber < utf8SourceInfo->GetLineCount())
    {
        charcount_t charPosition = 0;
        charcount_t byteOffset = 0;
        utf8SourceInfo->GetCharPositionForLineInfo((charcount_t)lineNumber, &charPosition, &byteOffset);
        long ibos = charPosition + columnNumber + 1;

        Js::StatementLocation statement;
        if(!debugDocument->GetStatementLocation(ibos, &statement))
        {
            return nullptr;
        }

        // Don't see a use case for supporting multiple breakpoints at same location.
        // If a breakpoint already exists, just return that
        Js::BreakpointProbe* probe = debugDocument->FindBreakpoint(statement);
        TTDAssert(probe == nullptr || desiredBpId == -1, "We shouldn't be resetting this BP unless it was cleared earlier!");

        if(probe == nullptr)
        {
            probe = debugDocument->SetBreakPoint_TTDWbpId(desiredBpId, statement);
            *isNewBP = TRUE;

            this->GetDebugDocumentManager()->AddDocument(probe->GetId(), debugDocument);
        }

        return probe;
    }

    return nullptr;
}